

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddTwiceListedError(google::protobuf::FileDescriptorProto_const&,int)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar1;
  AlphaNum local_70;
  AlphaNum local_40;
  
  local_40.piece_._M_len = 8;
  local_40.piece_._M_str = "Import \"";
  pVVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                     ((RepeatedPtrFieldBase *)(*(long *)this + 0x18),**(int **)(this + 8));
  local_70.piece_._M_str = (pVVar1->_M_dataplus)._M_p;
  local_70.piece_._M_len = pVVar1->_M_string_length;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_40,&local_70);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}